

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O1

shared_ptr<duckdb::Relation,_true> __thiscall
duckdb::Connection::Table(Connection *this,string *schema_name,string *table_name)

{
  element_type *peVar1;
  undefined8 uVar2;
  ClientContext *database_name;
  CatalogException *this_00;
  string *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  pointer *__ptr;
  shared_ptr<duckdb::Relation,_true> sVar4;
  unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
  table_info;
  undefined1 local_a8 [16];
  undefined1 local_98 [32];
  __native_type local_78;
  string local_50;
  
  peVar1 = (element_type *)(local_98 + 0x10);
  local_98._0_8_ = peVar1;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_a8 + 0x10),anon_var_dwarf_63b5960 + 9);
  database_name =
       shared_ptr<duckdb::ClientContext,_true>::operator->
                 ((shared_ptr<duckdb::ClientContext,_true> *)schema_name);
  ClientContext::TableInfo
            ((ClientContext *)local_a8,(string *)database_name,(string *)(local_a8 + 0x10),
             table_name);
  if ((element_type *)local_98._0_8_ != peVar1) {
    operator_delete((void *)local_98._0_8_);
  }
  if ((element_type *)local_a8._0_8_ != (element_type *)0x0) {
    local_98._0_8_ = (element_type *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<duckdb::TableRelation,std::allocator<duckdb::TableRelation>,duckdb::shared_ptr<duckdb::ClientContext,true>&,duckdb::unique_ptr<duckdb::TableDescription,std::default_delete<duckdb::TableDescription>,true>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8),
               (TableRelation **)(local_a8 + 0x10),
               (allocator<duckdb::TableRelation> *)(local_a8 + 0xf),
               (shared_ptr<duckdb::ClientContext,_true> *)schema_name,
               (unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
                *)local_a8);
    shared_ptr<duckdb::TableRelation,_true>::shared_ptr
              ((shared_ptr<duckdb::TableRelation,_true> *)&local_78.__data,
               (shared_ptr<duckdb::TableRelation> *)(local_a8 + 0x10));
    _Var3._M_pi = extraout_RDX;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
      _Var3._M_pi = extraout_RDX_00;
    }
    uVar2 = local_78._8_8_;
    (this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_78._8_8_ = (pointer)0x0;
    (this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)local_78.__align;
    (this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
    if ((__uniq_ptr_impl<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>)
        local_a8._0_8_ !=
        (__uniq_ptr_impl<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>)
        0x0) {
      ::std::default_delete<duckdb::TableDescription>::operator()
                ((default_delete<duckdb::TableDescription> *)local_a8,
                 (TableDescription *)local_a8._0_8_);
      _Var3._M_pi = extraout_RDX_01;
    }
    sVar4.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Var3._M_pi;
    sVar4.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<duckdb::Relation,_true>)
           sVar4.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (CatalogException *)__cxa_allocate_exception(0x10);
  local_98._0_8_ = peVar1;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_a8 + 0x10),"Table %s does not exist!","");
  local_78.__align = (long)&local_78.__data.__kind;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,anon_var_dwarf_63b5960 + 9);
  ParseInfo::QualifierToString(&local_50,(string *)&local_78.__data,table_name,in_RCX);
  CatalogException::CatalogException<std::__cxx11::string>
            (this_00,(string *)(local_a8 + 0x10),&local_50);
  __cxa_throw(this_00,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

shared_ptr<Relation> Connection::Table(const string &schema_name, const string &table_name) {
	auto table_info = TableInfo(INVALID_CATALOG, schema_name, table_name);
	if (!table_info) {
		throw CatalogException("Table %s does not exist!", ParseInfo::QualifierToString("", schema_name, table_name));
	}
	return make_shared_ptr<TableRelation>(context, std::move(table_info));
}